

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc stbi__get8(stbi__context *s)

{
  stbi_uc *psVar1;
  stbi_uc sVar2;
  int iVar3;
  stbi_uc *psVar4;
  
  psVar1 = s->img_buffer;
  if (psVar1 < s->img_buffer_end) {
    s->img_buffer = psVar1 + 1;
    sVar2 = *psVar1;
  }
  else if (s->read_from_callbacks == 0) {
    sVar2 = '\0';
  }
  else {
    psVar1 = s->buffer_start;
    iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
    s->callback_already_read =
         s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
    if (iVar3 == 0) {
      s->read_from_callbacks = 0;
      psVar4 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar2 = '\0';
    }
    else {
      psVar4 = psVar1 + iVar3;
      sVar2 = *psVar1;
    }
    s->img_buffer_end = psVar4;
    s->img_buffer = s->buffer_start + 1;
  }
  return sVar2;
}

Assistant:

stbi_inline static stbi_uc stbi__get8(stbi__context *s)
{
   if (s->img_buffer < s->img_buffer_end)
      return *s->img_buffer++;
   if (s->read_from_callbacks) {
      stbi__refill_buffer(s);
      return *s->img_buffer++;
   }
   return 0;
}